

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  StateVerifier *pSVar2;
  QueryType QVar3;
  int iVar4;
  GetBooleanVerifier *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar6;
  TestLog *pTVar7;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetInteger64Verifier *this_02;
  undefined4 extraout_var_01;
  GetFloatVerifier *this_03;
  undefined4 extraout_var_02;
  ConstantMinimumValueTestCase *this_04;
  char *pcVar8;
  long lVar9;
  ConstantMaximumValueTestCase *this_05;
  SampleBuffersTestCase *this_06;
  SamplesTestCase *this_07;
  HintTestCase *pHVar10;
  DepthFuncTestCase *this_08;
  CullFaceTestCase *this_09;
  FrontFaceTestCase *this_10;
  ViewPortTestCase *this_11;
  ScissorBoxTestCase *this_12;
  MaxViewportDimsTestCase *this_13;
  StencilRefTestCase *pSVar11;
  StencilRefSeparateTestCase *pSVar12;
  StencilOpTestCase *pSVar13;
  TestNode *pTVar14;
  StencilFuncTestCase *this_14;
  StencilFuncSeparateTestCase *pSVar15;
  StencilMaskTestCase *pSVar16;
  StencilMaskSeparateTestCase *pSVar17;
  StencilWriteMaskTestCase *pSVar18;
  StencilWriteMaskSeparateTestCase *pSVar19;
  PixelStoreTestCase *this_15;
  PixelStoreAlignTestCase *pPVar20;
  BlendFuncTestCase *this_16;
  BlendEquationTestCase *this_17;
  ImplementationArrayTestCase *this_18;
  BufferBindingTestCase *this_19;
  StencilClearValueTestCase *this_20;
  ActiveTextureTestCase *this_21;
  void *pvVar21;
  TextureBindingTestCase *this_22;
  ImplementationColorReadTestCase *this_23;
  ReadBufferCase *this_24;
  DrawBufferCase *this_25;
  allocator<char> local_1d29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d08;
  StateVerifier *local_1ce8;
  StateVerifier *verifier_53;
  int _verifierNdx_53;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cb8;
  StateVerifier *local_1c98;
  StateVerifier *verifier_52;
  int _verifierNdx_52;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c68;
  StateVerifier *local_1c48;
  StateVerifier *verifier_51;
  int _verifierNdx_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c18;
  QueryType local_1bf4;
  uint local_1bf0;
  QueryType queryType_8;
  int _queryTypeNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bc8;
  QueryType local_1ba4;
  int local_1ba0;
  QueryType queryType_7;
  int _queryTypeNdx_7;
  int testNdx_8;
  TextureBinding textureBindings [4];
  allocator<char> local_1b29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b08;
  QueryType local_1ae4;
  int local_1ae0;
  QueryType queryType_6;
  int _queryTypeNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab8;
  QueryType local_1a94;
  int local_1a90;
  QueryType queryType_5;
  int _queryTypeNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a68;
  StateVerifier *local_1a48;
  StateVerifier *verifier_50;
  int _verifierNdx_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a18;
  StateVerifier *local_19f8;
  StateVerifier *verifier_49;
  int _verifierNdx_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19c8;
  QueryType local_19a4;
  int local_19a0;
  QueryType queryType_4;
  int _queryTypeNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1978;
  QueryType local_1954;
  int local_1950;
  QueryType queryType_3;
  int _queryTypeNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1928;
  QueryType local_1904;
  int local_1900;
  QueryType queryType_2;
  int _queryTypeNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18d8;
  QueryType local_18b4;
  int local_18b0;
  QueryType queryType_1;
  int _queryTypeNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1888;
  QueryType local_1864;
  int local_1860;
  QueryType queryType;
  int _queryTypeNdx;
  int testNdx_7;
  BufferBindingState bufferBindingStates [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1788;
  StateVerifier *local_1768;
  StateVerifier *verifier_48;
  int _verifierNdx_48;
  int testNdx_6;
  ImplementationArrayReturningState implementationArrayReturningStates [3];
  allocator<char> local_16e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a8;
  StateVerifier *local_1688;
  StateVerifier *verifier_47;
  int _verifierNdx_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658;
  StateVerifier *local_1638;
  StateVerifier *verifier_46;
  int _verifierNdx_46;
  int testNdx_5;
  BlendEquationState blendEquationStates [2];
  allocator<char> local_15e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a8;
  StateVerifier *local_1588;
  StateVerifier *verifier_45;
  int _verifierNdx_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1558;
  StateVerifier *local_1538;
  StateVerifier *verifier_44;
  int _verifierNdx_44;
  int testNdx_4;
  BlendColorState blendColorStates [4];
  allocator<char> local_14b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1498;
  StateVerifier *local_1478;
  StateVerifier *verifier_43;
  int _verifierNdx_43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448;
  StateVerifier *local_1428;
  StateVerifier *verifier_42;
  int _verifierNdx_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f8;
  StateVerifier *local_13d8;
  StateVerifier *verifier_41;
  int _verifierNdx_41;
  int testNdx_3;
  PixelStoreState pixelStoreStates [8];
  allocator<char> local_12f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d8;
  StateVerifier *local_12b8;
  StateVerifier *verifier_40;
  int _verifierNdx_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  StateVerifier *local_1268;
  StateVerifier *verifier_39;
  int _verifierNdx_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1238;
  StateVerifier *local_1218;
  StateVerifier *verifier_38;
  int _verifierNdx_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  StateVerifier *local_11c8;
  StateVerifier *verifier_37;
  int _verifierNdx_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  StateVerifier *local_1178;
  StateVerifier *verifier_36;
  int _verifierNdx_36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  StateVerifier *local_1128;
  StateVerifier *verifier_35;
  int _verifierNdx_35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  StateVerifier *local_10d8;
  StateVerifier *verifier_34;
  int _verifierNdx_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a8;
  StateVerifier *local_1088;
  StateVerifier *verifier_33;
  int _verifierNdx_33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  StateVerifier *local_1038;
  StateVerifier *verifier_32;
  int _verifierNdx_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1008;
  StateVerifier *local_fe8;
  StateVerifier *verifier_31;
  int _verifierNdx_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  StateVerifier *local_f98;
  StateVerifier *verifier_30;
  int _verifierNdx_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68;
  StateVerifier *local_f48;
  StateVerifier *verifier_29;
  int _verifierNdx_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18;
  StateVerifier *local_ef8;
  StateVerifier *verifier_28;
  int _verifierNdx_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec8;
  StateVerifier *local_ea8;
  StateVerifier *verifier_27;
  int _verifierNdx_27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e78;
  StateVerifier *local_e58;
  StateVerifier *verifier_26;
  int _verifierNdx_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  StateVerifier *local_e08;
  StateVerifier *verifier_25;
  int _verifierNdx_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  StateVerifier *local_db8;
  StateVerifier *verifier_24;
  int _verifierNdx_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  StateVerifier *local_d28;
  StateVerifier *verifier_23;
  int _verifierNdx_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  StateVerifier *local_c98;
  StateVerifier *verifier_22;
  int _verifierNdx_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  StateVerifier *local_c08;
  StateVerifier *verifier_21;
  int _verifierNdx_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  StateVerifier *local_b78;
  StateVerifier *verifier_20;
  int _verifierNdx_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  StateVerifier *local_b08;
  StateVerifier *verifier_19;
  int _verifierNdx_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  StateVerifier *local_a98;
  StateVerifier *verifier_18;
  int _verifierNdx_18;
  int testNdx_2;
  NamedStencilOp stencilOps [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  StateVerifier *local_9c8;
  StateVerifier *verifier_17;
  int _verifierNdx_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  StateVerifier *local_978;
  StateVerifier *verifier_16;
  int _verifierNdx_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  StateVerifier *local_928;
  StateVerifier *verifier_15;
  int _verifierNdx_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  StateVerifier *local_8d8;
  StateVerifier *verifier_14;
  int _verifierNdx_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  StateVerifier *local_888;
  StateVerifier *verifier_13;
  int _verifierNdx_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  StateVerifier *local_838;
  StateVerifier *verifier_12;
  int _verifierNdx_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  StateVerifier *local_7e8;
  StateVerifier *verifier_11;
  int _verifierNdx_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  StateVerifier *local_798;
  StateVerifier *verifier_10;
  int _verifierNdx_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  StateVerifier *local_748;
  StateVerifier *verifier_9;
  int _verifierNdx_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  StateVerifier *local_6f8;
  StateVerifier *verifier_8;
  int _verifierNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  StateVerifier *local_6a8;
  StateVerifier *verifier_7;
  int _verifierNdx_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  StateVerifier *local_658;
  StateVerifier *verifier_6;
  int _verifierNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  StateVerifier *local_608;
  StateVerifier *verifier_5;
  int _verifierNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  StateVerifier *local_5b8;
  StateVerifier *verifier_4;
  int _verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  StateVerifier *local_568;
  StateVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  StateVerifier *local_518;
  StateVerifier *verifier_2;
  GetBooleanVerifier *pGStack_508;
  int _verifierNdx_2;
  StateVerifier *normalVerifiers [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  StateVerifier *local_4a0;
  StateVerifier *verifier_1;
  int local_490;
  int _verifierNdx_1;
  int testNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  StateVerifier *local_448;
  StateVerifier *verifier;
  int _verifierNdx;
  int testNdx;
  StateVerifier *implementationLimitVerifiers [3];
  undefined8 local_418;
  LimitedStateInteger implementationMaxLimits [2];
  LimitedStateInteger implementationMinLimits [40];
  IntegerStateQueryTests *this_local;
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar4),pTVar7);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar4),pTVar7);
  this->m_verifierInteger = this_01;
  this_02 = (GetInteger64Verifier *)operator_new(0x28);
  pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetInteger64Verifier::GetInteger64Verifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar4),pTVar7);
  this->m_verifierInteger64 = this_02;
  this_03 = (GetFloatVerifier *)operator_new(0x28);
  pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_03,(Functions *)CONCAT44(extraout_var_02,iVar4),pTVar7);
  this->m_verifierFloat = this_03;
  memcpy(&implementationMaxLimits[1].targetName,&PTR_anon_var_dwarf_3b5d25_015a43e0,0x3c0);
  memcpy(&local_418,&PTR_anon_var_dwarf_ebced_015a47a0,0x30);
  __verifierNdx = this->m_verifierBoolean;
  implementationLimitVerifiers[0] = &this->m_verifierInteger64->super_StateVerifier;
  implementationLimitVerifiers[1] = &this->m_verifierFloat->super_StateVerifier;
  for (verifier._4_4_ = 0; verifier._4_4_ < 0x28; verifier._4_4_ = verifier._4_4_ + 1) {
    for (verifier._0_4_ = 0; (int)verifier < 3; verifier._0_4_ = (int)verifier + 1) {
      local_448 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier * 2);
      this_04 = (ConstantMinimumValueTestCase *)operator_new(0xa8);
      pSVar2 = local_448;
      _verifierNdx_1._2_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)&implementationMaxLimits[(long)verifier._4_4_ + 1].targetName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testNdx_1,pcVar8,(allocator<char> *)((long)&_verifierNdx_1 + 3));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_448);
      std::operator+(&local_468,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&testNdx_1
                     ,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier._4_4_;
      anon_unknown_2::ConstantMinimumValueTestCase::ConstantMinimumValueTestCase
                (this_04,pCVar1,pSVar2,pcVar8,implementationMinLimits[lVar9].name,
                 *(GLenum *)&implementationMinLimits[lVar9].description,
                 *(GLint *)((long)&implementationMinLimits[lVar9].description + 4));
      _verifierNdx_1._2_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&testNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&_verifierNdx_1 + 3));
    }
  }
  for (local_490 = 0; local_490 < 2; local_490 = local_490 + 1) {
    for (verifier_1._4_4_ = 0; verifier_1._4_4_ < 3; verifier_1._4_4_ = verifier_1._4_4_ + 1) {
      local_4a0 = *(StateVerifier **)(&_verifierNdx + (long)verifier_1._4_4_ * 2);
      this_05 = (ConstantMaximumValueTestCase *)operator_new(0xa8);
      pSVar2 = local_4a0;
      normalVerifiers[3]._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)&implementationMaxLimits[(long)local_490 + -1].targetName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,pcVar8,(allocator<char> *)((long)normalVerifiers + 0x1f));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_4a0);
      std::operator+(&local_4c0,&local_4e0,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)local_490;
      anon_unknown_2::ConstantMaximumValueTestCase::ConstantMaximumValueTestCase
                (this_05,pCVar1,pSVar2,pcVar8,implementationMaxLimits[lVar9].name,
                 *(GLenum *)&implementationMaxLimits[lVar9].description,
                 *(GLint *)((long)&implementationMaxLimits[lVar9].description + 4));
      normalVerifiers[3]._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)normalVerifiers + 0x1f));
    }
  }
  pGStack_508 = this->m_verifierBoolean;
  normalVerifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[1] = &this->m_verifierInteger64->super_StateVerifier;
  normalVerifiers[2] = &this->m_verifierFloat->super_StateVerifier;
  for (verifier_2._4_4_ = 0; verifier_2._4_4_ < 3; verifier_2._4_4_ = verifier_2._4_4_ + 1) {
    local_518 = *(StateVerifier **)(&_verifierNdx + (long)verifier_2._4_4_ * 2);
    this_06 = (SampleBuffersTestCase *)operator_new(0xa0);
    pSVar2 = local_518;
    verifier_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_3,"sample_buffers",(allocator<char> *)((long)&verifier_3 + 7)
              );
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_518);
    std::operator+(&local_538,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_3,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleBuffersTestCase::SampleBuffersTestCase
              (this_06,pCVar1,pSVar2,pcVar8,"SAMPLE_BUFFERS");
    verifier_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&_verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
  }
  for (verifier_3._0_4_ = 0; (int)verifier_3 < 4; verifier_3._0_4_ = (int)verifier_3 + 1) {
    local_568 = normalVerifiers[(long)(int)verifier_3 + -1];
    this_07 = (SamplesTestCase *)operator_new(0xa0);
    pSVar2 = local_568;
    verifier_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_4,"samples",(allocator<char> *)((long)&verifier_4 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_568);
    std::operator+(&local_588,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_4,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SamplesTestCase::SamplesTestCase(this_07,pCVar1,pSVar2,pcVar8,"SAMPLES");
    verifier_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&_verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_4 + 7));
  }
  for (verifier_4._0_4_ = 0; (int)verifier_4 < 4; verifier_4._0_4_ = (int)verifier_4 + 1) {
    local_5b8 = normalVerifiers[(long)(int)verifier_4 + -1];
    pHVar10 = (HintTestCase *)operator_new(0xa8);
    pSVar2 = local_5b8;
    verifier_5._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_5,"generate_mipmap_hint",
               (allocator<char> *)((long)&verifier_5 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_5b8);
    std::operator+(&local_5d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_5,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::HintTestCase::HintTestCase
              (pHVar10,pCVar1,pSVar2,pcVar8,"GENERATE_MIPMAP_HINT",0x8192);
    verifier_5._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pHVar10);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&_verifierNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_5 + 7));
  }
  for (verifier_5._0_4_ = 0; (int)verifier_5 < 4; verifier_5._0_4_ = (int)verifier_5 + 1) {
    local_608 = normalVerifiers[(long)(int)verifier_5 + -1];
    pHVar10 = (HintTestCase *)operator_new(0xa8);
    pSVar2 = local_608;
    verifier_6._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_6,"fragment_shader_derivative_hint",
               (allocator<char> *)((long)&verifier_6 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_608);
    std::operator+(&local_628,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_6,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::HintTestCase::HintTestCase
              (pHVar10,pCVar1,pSVar2,pcVar8,"FRAGMENT_SHADER_DERIVATIVE_HINT",0x8b8b);
    verifier_6._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pHVar10);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&_verifierNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_6 + 7));
  }
  for (verifier_6._0_4_ = 0; (int)verifier_6 < 4; verifier_6._0_4_ = (int)verifier_6 + 1) {
    local_658 = normalVerifiers[(long)(int)verifier_6 + -1];
    this_08 = (DepthFuncTestCase *)operator_new(0xa0);
    pSVar2 = local_658;
    verifier_7._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_7,"depth_func",(allocator<char> *)((long)&verifier_7 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_658);
    std::operator+(&local_678,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_7,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthFuncTestCase::DepthFuncTestCase(this_08,pCVar1,pSVar2,pcVar8,"DEPTH_FUNC");
    verifier_7._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&_verifierNdx_7);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_7 + 7));
  }
  for (verifier_7._0_4_ = 0; (int)verifier_7 < 4; verifier_7._0_4_ = (int)verifier_7 + 1) {
    local_6a8 = normalVerifiers[(long)(int)verifier_7 + -1];
    this_09 = (CullFaceTestCase *)operator_new(0xa0);
    pSVar2 = local_6a8;
    verifier_8._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_8,"cull_face_mode",(allocator<char> *)((long)&verifier_8 + 7)
              );
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_6a8);
    std::operator+(&local_6c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::CullFaceTestCase::CullFaceTestCase
              (this_09,pCVar1,pSVar2,pcVar8,"CULL_FACE_MODE");
    verifier_8._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&_verifierNdx_8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_8 + 7));
  }
  for (verifier_8._0_4_ = 0; (int)verifier_8 < 4; verifier_8._0_4_ = (int)verifier_8 + 1) {
    local_6f8 = normalVerifiers[(long)(int)verifier_8 + -1];
    this_10 = (FrontFaceTestCase *)operator_new(0xa0);
    pSVar2 = local_6f8;
    verifier_9._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_9,"front_face_mode",
               (allocator<char> *)((long)&verifier_9 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_6f8);
    std::operator+(&local_718,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_9,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::FrontFaceTestCase::FrontFaceTestCase(this_10,pCVar1,pSVar2,pcVar8,"FRONT_FACE");
    verifier_9._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&_verifierNdx_9);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_9 + 7));
  }
  for (verifier_9._0_4_ = 0; (int)verifier_9 < 4; verifier_9._0_4_ = (int)verifier_9 + 1) {
    local_748 = normalVerifiers[(long)(int)verifier_9 + -1];
    this_11 = (ViewPortTestCase *)operator_new(0xa0);
    pSVar2 = local_748;
    verifier_10._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_10,"viewport",(allocator<char> *)((long)&verifier_10 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_748);
    std::operator+(&local_768,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_10,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ViewPortTestCase::ViewPortTestCase(this_11,pCVar1,pSVar2,pcVar8,"VIEWPORT");
    verifier_10._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&_verifierNdx_10);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_10 + 7));
  }
  for (verifier_10._0_4_ = 0; (int)verifier_10 < 4; verifier_10._0_4_ = (int)verifier_10 + 1) {
    local_798 = normalVerifiers[(long)(int)verifier_10 + -1];
    this_12 = (ScissorBoxTestCase *)operator_new(0xa0);
    pSVar2 = local_798;
    verifier_11._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_11,"scissor_box",(allocator<char> *)((long)&verifier_11 + 7))
    ;
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_798);
    std::operator+(&local_7b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_11,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ScissorBoxTestCase::ScissorBoxTestCase
              (this_12,pCVar1,pSVar2,pcVar8,"SCISSOR_BOX");
    verifier_11._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&_verifierNdx_11);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_11 + 7));
  }
  for (verifier_11._0_4_ = 0; (int)verifier_11 < 4; verifier_11._0_4_ = (int)verifier_11 + 1) {
    local_7e8 = normalVerifiers[(long)(int)verifier_11 + -1];
    this_13 = (MaxViewportDimsTestCase *)operator_new(0xa0);
    pSVar2 = local_7e8;
    verifier_12._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_12,"max_viewport_dims",
               (allocator<char> *)((long)&verifier_12 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_7e8);
    std::operator+(&local_808,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_12,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::MaxViewportDimsTestCase::MaxViewportDimsTestCase
              (this_13,pCVar1,pSVar2,pcVar8,"MAX_VIEWPORT_DIMS");
    verifier_12._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&_verifierNdx_12);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_12 + 7));
  }
  for (verifier_12._0_4_ = 0; (int)verifier_12 < 4; verifier_12._0_4_ = (int)verifier_12 + 1) {
    local_838 = normalVerifiers[(long)(int)verifier_12 + -1];
    pSVar11 = (StencilRefTestCase *)operator_new(0xa8);
    pSVar2 = local_838;
    verifier_13._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_13,"stencil_ref",(allocator<char> *)((long)&verifier_13 + 7))
    ;
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_838);
    std::operator+(&local_858,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_13,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar11,pCVar1,pSVar2,pcVar8,"STENCIL_REF",0xb97);
    verifier_13._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
    std::__cxx11::string::~string((string *)&local_858);
    std::__cxx11::string::~string((string *)&_verifierNdx_13);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_13 + 7));
  }
  for (verifier_13._0_4_ = 0; (int)verifier_13 < 4; verifier_13._0_4_ = (int)verifier_13 + 1) {
    local_888 = normalVerifiers[(long)(int)verifier_13 + -1];
    pSVar11 = (StencilRefTestCase *)operator_new(0xa8);
    pSVar2 = local_888;
    verifier_14._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_14,"stencil_back_ref",
               (allocator<char> *)((long)&verifier_14 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_888);
    std::operator+(&local_8a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_14,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar11,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_REF",0x8ca3);
    verifier_14._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&_verifierNdx_14);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_14 + 7));
  }
  for (verifier_14._0_4_ = 0; (int)verifier_14 < 4; verifier_14._0_4_ = (int)verifier_14 + 1) {
    local_8d8 = normalVerifiers[(long)(int)verifier_14 + -1];
    pSVar12 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_8d8;
    verifier_15._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_15,"stencil_ref_separate",
               (allocator<char> *)((long)&verifier_15 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_8d8);
    std::operator+(&local_8f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_15,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar12,pCVar1,pSVar2,pcVar8,"STENCIL_REF (separate)",0xb97,0x404);
    verifier_15._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&_verifierNdx_15);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_15 + 7));
  }
  for (verifier_15._0_4_ = 0; (int)verifier_15 < 4; verifier_15._0_4_ = (int)verifier_15 + 1) {
    local_928 = normalVerifiers[(long)(int)verifier_15 + -1];
    pSVar12 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_928;
    verifier_16._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_16,"stencil_ref_separate_both",
               (allocator<char> *)((long)&verifier_16 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_928);
    std::operator+(&local_948,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_16,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar12,pCVar1,pSVar2,pcVar8,"STENCIL_REF (separate)",0xb97,0x408);
    verifier_16._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&_verifierNdx_16);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_16 + 7));
  }
  for (verifier_16._0_4_ = 0; (int)verifier_16 < 4; verifier_16._0_4_ = (int)verifier_16 + 1) {
    local_978 = normalVerifiers[(long)(int)verifier_16 + -1];
    pSVar12 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_978;
    verifier_17._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_17,"stencil_back_ref_separate",
               (allocator<char> *)((long)&verifier_17 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_978);
    std::operator+(&local_998,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_17,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar12,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_REF (separate)",0x8ca3,0x405);
    verifier_17._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&_verifierNdx_17);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_17 + 7));
  }
  for (verifier_17._0_4_ = 0; (int)verifier_17 < 4; verifier_17._0_4_ = (int)verifier_17 + 1) {
    local_9c8 = normalVerifiers[(long)(int)verifier_17 + -1];
    pSVar12 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_9c8;
    stencilOps[2]._38_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a08,"stencil_back_ref_separate_both",
               (allocator<char> *)&stencilOps[2].field_0x27);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_9c8);
    std::operator+(&local_9e8,&local_a08,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar12,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_REF (separate)",0x8ca3,0x408);
    stencilOps[2]._38_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator((allocator<char> *)&stencilOps[2].field_0x27);
  }
  memcpy(&_verifierNdx_18,&DAT_015a47d0,0x78);
  for (verifier_18._4_4_ = 0; verifier_18._4_4_ < 3; verifier_18._4_4_ = verifier_18._4_4_ + 1) {
    for (verifier_18._0_4_ = 0; (int)verifier_18 < 4; verifier_18._0_4_ = (int)verifier_18 + 1) {
      local_a98 = normalVerifiers[(long)(int)verifier_18 + -1];
      pSVar13 = (StencilOpTestCase *)operator_new(0xa8);
      pSVar2 = local_a98;
      verifier_19._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_19,"stencil_",(allocator<char> *)((long)&verifier_19 + 7));
      std::operator+(&local_ad8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_19,*(char **)(&_verifierNdx_18 + (long)verifier_18._4_4_ * 10));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_a98);
      std::operator+(&local_ab8,&local_ad8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar13,pCVar1,pSVar2,pcVar8,stencilOps[verifier_18._4_4_].name,
                 *(GLenum *)&stencilOps[verifier_18._4_4_].frontDescription);
      verifier_19._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::__cxx11::string::~string((string *)&_verifierNdx_19);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_19 + 7));
    }
    for (verifier_19._0_4_ = 0; (int)verifier_19 < 4; verifier_19._0_4_ = (int)verifier_19 + 1) {
      local_b08 = normalVerifiers[(long)(int)verifier_19 + -1];
      pSVar13 = (StencilOpTestCase *)operator_new(0xa8);
      pSVar2 = local_b08;
      verifier_20._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_20,"stencil_back_",
                 (allocator<char> *)((long)&verifier_20 + 7));
      std::operator+(&local_b48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_20,*(char **)(&_verifierNdx_18 + (long)verifier_18._4_4_ * 10));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_b08);
      std::operator+(&local_b28,&local_b48,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar13,pCVar1,pSVar2,pcVar8,*(char **)&stencilOps[verifier_18._4_4_].frontTarget,
                 *(GLenum *)&stencilOps[verifier_18._4_4_].backDescription);
      verifier_20._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
      std::__cxx11::string::~string((string *)&local_b28);
      std::__cxx11::string::~string((string *)&local_b48);
      std::__cxx11::string::~string((string *)&_verifierNdx_20);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_20 + 7));
    }
    for (verifier_20._0_4_ = 0; (int)verifier_20 < 4; verifier_20._0_4_ = (int)verifier_20 + 1) {
      local_b78 = normalVerifiers[(long)(int)verifier_20 + -1];
      pTVar14 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_b78;
      verifier_21._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_21,"stencil_",(allocator<char> *)((long)&verifier_21 + 7));
      std::operator+(&local_bd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_21,*(char **)(&_verifierNdx_18 + (long)verifier_18._4_4_ * 10));
      std::operator+(&local_bb8,&local_bd8,"_separate_both");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_b78);
      std::operator+(&local_b98,&local_bb8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar14,pCVar1,pSVar2,pcVar8,
                 stencilOps[verifier_18._4_4_].name,
                 *(GLenum *)&stencilOps[verifier_18._4_4_].frontDescription,0x408);
      verifier_21._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar14);
      std::__cxx11::string::~string((string *)&local_b98);
      std::__cxx11::string::~string((string *)&local_bb8);
      std::__cxx11::string::~string((string *)&local_bd8);
      std::__cxx11::string::~string((string *)&_verifierNdx_21);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_21 + 7));
    }
    for (verifier_21._0_4_ = 0; (int)verifier_21 < 4; verifier_21._0_4_ = (int)verifier_21 + 1) {
      local_c08 = normalVerifiers[(long)(int)verifier_21 + -1];
      pTVar14 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_c08;
      verifier_22._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_22,"stencil_back_",
                 (allocator<char> *)((long)&verifier_22 + 7));
      std::operator+(&local_c68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_22,*(char **)(&_verifierNdx_18 + (long)verifier_18._4_4_ * 10));
      std::operator+(&local_c48,&local_c68,"_separate_both");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_c08);
      std::operator+(&local_c28,&local_c48,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar14,pCVar1,pSVar2,pcVar8,
                 *(char **)&stencilOps[verifier_18._4_4_].frontTarget,
                 *(GLenum *)&stencilOps[verifier_18._4_4_].backDescription,0x408);
      verifier_22._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar14);
      std::__cxx11::string::~string((string *)&local_c28);
      std::__cxx11::string::~string((string *)&local_c48);
      std::__cxx11::string::~string((string *)&local_c68);
      std::__cxx11::string::~string((string *)&_verifierNdx_22);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_22 + 7));
    }
    for (verifier_22._0_4_ = 0; (int)verifier_22 < 4; verifier_22._0_4_ = (int)verifier_22 + 1) {
      local_c98 = normalVerifiers[(long)(int)verifier_22 + -1];
      pTVar14 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_c98;
      verifier_23._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_23,"stencil_",(allocator<char> *)((long)&verifier_23 + 7));
      std::operator+(&local_cf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_23,*(char **)(&_verifierNdx_18 + (long)verifier_18._4_4_ * 10));
      std::operator+(&local_cd8,&local_cf8,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_c98);
      std::operator+(&local_cb8,&local_cd8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar14,pCVar1,pSVar2,pcVar8,
                 stencilOps[verifier_18._4_4_].name,
                 *(GLenum *)&stencilOps[verifier_18._4_4_].frontDescription,0x404);
      verifier_23._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar14);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::__cxx11::string::~string((string *)&local_cf8);
      std::__cxx11::string::~string((string *)&_verifierNdx_23);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_23 + 7));
    }
    for (verifier_23._0_4_ = 0; (int)verifier_23 < 4; verifier_23._0_4_ = (int)verifier_23 + 1) {
      local_d28 = normalVerifiers[(long)(int)verifier_23 + -1];
      pTVar14 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_d28;
      verifier_24._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_24,"stencil_back_",
                 (allocator<char> *)((long)&verifier_24 + 7));
      std::operator+(&local_d88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_24,*(char **)(&_verifierNdx_18 + (long)verifier_18._4_4_ * 10));
      std::operator+(&local_d68,&local_d88,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_d28);
      std::operator+(&local_d48,&local_d68,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar14,pCVar1,pSVar2,pcVar8,
                 *(char **)&stencilOps[verifier_18._4_4_].frontTarget,
                 *(GLenum *)&stencilOps[verifier_18._4_4_].backDescription,0x405);
      verifier_24._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar14);
      std::__cxx11::string::~string((string *)&local_d48);
      std::__cxx11::string::~string((string *)&local_d68);
      std::__cxx11::string::~string((string *)&local_d88);
      std::__cxx11::string::~string((string *)&_verifierNdx_24);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_24 + 7));
    }
  }
  for (verifier_24._0_4_ = 0; (int)verifier_24 < 4; verifier_24._0_4_ = (int)verifier_24 + 1) {
    local_db8 = normalVerifiers[(long)(int)verifier_24 + -1];
    this_14 = (StencilFuncTestCase *)operator_new(0xa0);
    pSVar2 = local_db8;
    verifier_25._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_25,"stencil_func",(allocator<char> *)((long)&verifier_25 + 7)
              );
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_db8);
    std::operator+(&local_dd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_25,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncTestCase::StencilFuncTestCase
              (this_14,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC");
    verifier_25._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
    std::__cxx11::string::~string((string *)&local_dd8);
    std::__cxx11::string::~string((string *)&_verifierNdx_25);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_25 + 7));
  }
  for (verifier_25._0_4_ = 0; (int)verifier_25 < 4; verifier_25._0_4_ = (int)verifier_25 + 1) {
    local_e08 = normalVerifiers[(long)(int)verifier_25 + -1];
    pSVar15 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_e08;
    verifier_26._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_26,"stencil_func_separate",
               (allocator<char> *)((long)&verifier_26 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_e08);
    std::operator+(&local_e28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_26,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar15,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0xb92,0x404);
    verifier_26._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_e28);
    std::__cxx11::string::~string((string *)&_verifierNdx_26);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_26 + 7));
  }
  for (verifier_26._0_4_ = 0; (int)verifier_26 < 4; verifier_26._0_4_ = (int)verifier_26 + 1) {
    local_e58 = normalVerifiers[(long)(int)verifier_26 + -1];
    pSVar15 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_e58;
    verifier_27._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_27,"stencil_func_separate_both",
               (allocator<char> *)((long)&verifier_27 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_e58);
    std::operator+(&local_e78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_27,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar15,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0xb92,0x408);
    verifier_27._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_e78);
    std::__cxx11::string::~string((string *)&_verifierNdx_27);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_27 + 7));
  }
  for (verifier_27._0_4_ = 0; (int)verifier_27 < 4; verifier_27._0_4_ = (int)verifier_27 + 1) {
    local_ea8 = normalVerifiers[(long)(int)verifier_27 + -1];
    pSVar15 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_ea8;
    verifier_28._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_28,"stencil_back_func_separate",
               (allocator<char> *)((long)&verifier_28 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_ea8);
    std::operator+(&local_ec8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_28,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar15,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0x8800,0x405);
    verifier_28._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_ec8);
    std::__cxx11::string::~string((string *)&_verifierNdx_28);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_28 + 7));
  }
  for (verifier_28._0_4_ = 0; (int)verifier_28 < 4; verifier_28._0_4_ = (int)verifier_28 + 1) {
    local_ef8 = normalVerifiers[(long)(int)verifier_28 + -1];
    pSVar15 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_ef8;
    verifier_29._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_29,"stencil_back_func_separate_both",
               (allocator<char> *)((long)&verifier_29 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_ef8);
    std::operator+(&local_f18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_29,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar15,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0x8800,0x408);
    verifier_29._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_f18);
    std::__cxx11::string::~string((string *)&_verifierNdx_29);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_29 + 7));
  }
  for (verifier_29._0_4_ = 0; (int)verifier_29 < 4; verifier_29._0_4_ = (int)verifier_29 + 1) {
    local_f48 = normalVerifiers[(long)(int)verifier_29 + -1];
    pSVar16 = (StencilMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_f48;
    verifier_30._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_30,"stencil_value_mask",
               (allocator<char> *)((long)&verifier_30 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_f48);
    std::operator+(&local_f68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_30,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar16,pCVar1,pSVar2,pcVar8,"STENCIL_VALUE_MASK",0xb93);
    verifier_30._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_f68);
    std::__cxx11::string::~string((string *)&_verifierNdx_30);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_30 + 7));
  }
  for (verifier_30._0_4_ = 0; (int)verifier_30 < 4; verifier_30._0_4_ = (int)verifier_30 + 1) {
    local_f98 = normalVerifiers[(long)(int)verifier_30 + -1];
    pSVar16 = (StencilMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_f98;
    verifier_31._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_31,"stencil_back_value_mask",
               (allocator<char> *)((long)&verifier_31 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_f98);
    std::operator+(&local_fb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_31,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar16,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_VALUE_MASK",0x8ca4);
    verifier_31._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_fb8);
    std::__cxx11::string::~string((string *)&_verifierNdx_31);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_31 + 7));
  }
  for (verifier_31._0_4_ = 0; (int)verifier_31 < 4; verifier_31._0_4_ = (int)verifier_31 + 1) {
    local_fe8 = normalVerifiers[(long)(int)verifier_31 + -1];
    pSVar17 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_fe8;
    verifier_32._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_32,"stencil_value_mask_separate",
               (allocator<char> *)((long)&verifier_32 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_fe8);
    std::operator+(&local_1008,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_32,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar17,pCVar1,pSVar2,pcVar8,"STENCIL_VALUE_MASK (separate)",0xb93,0x404);
    verifier_32._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_1008);
    std::__cxx11::string::~string((string *)&_verifierNdx_32);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_32 + 7));
  }
  for (verifier_32._0_4_ = 0; (int)verifier_32 < 4; verifier_32._0_4_ = (int)verifier_32 + 1) {
    local_1038 = normalVerifiers[(long)(int)verifier_32 + -1];
    pSVar17 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_1038;
    verifier_33._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_33,"stencil_value_mask_separate_both",
               (allocator<char> *)((long)&verifier_33 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1038);
    std::operator+(&local_1058,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_33,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar17,pCVar1,pSVar2,pcVar8,"STENCIL_VALUE_MASK (separate)",0xb93,0x408);
    verifier_33._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_1058);
    std::__cxx11::string::~string((string *)&_verifierNdx_33);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_33 + 7));
  }
  for (verifier_33._0_4_ = 0; (int)verifier_33 < 4; verifier_33._0_4_ = (int)verifier_33 + 1) {
    local_1088 = normalVerifiers[(long)(int)verifier_33 + -1];
    pSVar17 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_1088;
    verifier_34._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_34,"stencil_back_value_mask_separate",
               (allocator<char> *)((long)&verifier_34 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1088);
    std::operator+(&local_10a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_34,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar17,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_VALUE_MASK (separate)",0x8ca4,0x405);
    verifier_34._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_10a8);
    std::__cxx11::string::~string((string *)&_verifierNdx_34);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_34 + 7));
  }
  for (verifier_34._0_4_ = 0; (int)verifier_34 < 4; verifier_34._0_4_ = (int)verifier_34 + 1) {
    local_10d8 = normalVerifiers[(long)(int)verifier_34 + -1];
    pSVar17 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_10d8;
    verifier_35._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_35,"stencil_back_value_mask_separate_both",
               (allocator<char> *)((long)&verifier_35 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_10d8);
    std::operator+(&local_10f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_35,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar17,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_VALUE_MASK (separate)",0x8ca4,0x408);
    verifier_35._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_10f8);
    std::__cxx11::string::~string((string *)&_verifierNdx_35);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_35 + 7));
  }
  for (verifier_35._0_4_ = 0; (int)verifier_35 < 4; verifier_35._0_4_ = (int)verifier_35 + 1) {
    local_1128 = normalVerifiers[(long)(int)verifier_35 + -1];
    pSVar18 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_1128;
    verifier_36._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_36,"stencil_writemask",
               (allocator<char> *)((long)&verifier_36 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1128);
    std::operator+(&local_1148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_36,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar18,pCVar1,pSVar2,pcVar8,"STENCIL_WRITEMASK",0xb98);
    verifier_36._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_1148);
    std::__cxx11::string::~string((string *)&_verifierNdx_36);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_36 + 7));
  }
  for (verifier_36._0_4_ = 0; (int)verifier_36 < 4; verifier_36._0_4_ = (int)verifier_36 + 1) {
    local_1178 = normalVerifiers[(long)(int)verifier_36 + -1];
    pSVar18 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_1178;
    verifier_37._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_37,"stencil_back_writemask",
               (allocator<char> *)((long)&verifier_37 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1178);
    std::operator+(&local_1198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_37,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar18,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_WRITEMASK",0x8ca5);
    verifier_37._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&_verifierNdx_37);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_37 + 7));
  }
  for (verifier_37._0_4_ = 0; (int)verifier_37 < 4; verifier_37._0_4_ = (int)verifier_37 + 1) {
    local_11c8 = normalVerifiers[(long)(int)verifier_37 + -1];
    pSVar19 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_11c8;
    verifier_38._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_38,"stencil_writemask_separate",
               (allocator<char> *)((long)&verifier_38 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_11c8);
    std::operator+(&local_11e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_38,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar19,pCVar1,pSVar2,pcVar8,"STENCIL_WRITEMASK (separate)",0xb98,0x404);
    verifier_38._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_11e8);
    std::__cxx11::string::~string((string *)&_verifierNdx_38);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_38 + 7));
  }
  for (verifier_38._0_4_ = 0; (int)verifier_38 < 4; verifier_38._0_4_ = (int)verifier_38 + 1) {
    local_1218 = normalVerifiers[(long)(int)verifier_38 + -1];
    pSVar19 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_1218;
    verifier_39._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_39,"stencil_writemask_separate_both",
               (allocator<char> *)((long)&verifier_39 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1218);
    std::operator+(&local_1238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_39,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar19,pCVar1,pSVar2,pcVar8,"STENCIL_WRITEMASK (separate)",0xb98,0x408);
    verifier_39._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_1238);
    std::__cxx11::string::~string((string *)&_verifierNdx_39);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_39 + 7));
  }
  for (verifier_39._0_4_ = 0; (int)verifier_39 < 4; verifier_39._0_4_ = (int)verifier_39 + 1) {
    local_1268 = normalVerifiers[(long)(int)verifier_39 + -1];
    pSVar19 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_1268;
    verifier_40._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_40,"stencil_back_writemask_separate",
               (allocator<char> *)((long)&verifier_40 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1268);
    std::operator+(&local_1288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_40,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar19,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_WRITEMASK (separate)",0x8ca5,0x405);
    verifier_40._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_1288);
    std::__cxx11::string::~string((string *)&_verifierNdx_40);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_40 + 7));
  }
  for (verifier_40._0_4_ = 0; (int)verifier_40 < 4; verifier_40._0_4_ = (int)verifier_40 + 1) {
    local_12b8 = normalVerifiers[(long)(int)verifier_40 + -1];
    pSVar19 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_12b8;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12f8,"stencil_back_writemask_separate_both",&local_12f9);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_12b8);
    std::operator+(&local_12d8,&local_12f8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar19,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_WRITEMASK (separate)",0x8ca5,0x408);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_12d8);
    std::__cxx11::string::~string((string *)&local_12f8);
    std::allocator<char>::~allocator(&local_12f9);
  }
  memcpy(&_verifierNdx_41,&PTR_anon_var_dwarf_3ece77_015a4850,0xc0);
  for (verifier_41._4_4_ = 0; verifier_41._4_4_ < 8; verifier_41._4_4_ = verifier_41._4_4_ + 1) {
    for (verifier_41._0_4_ = 0; (int)verifier_41 < 4; verifier_41._0_4_ = (int)verifier_41 + 1) {
      local_13d8 = normalVerifiers[(long)(int)verifier_41 + -1];
      this_15 = (PixelStoreTestCase *)operator_new(0xa8);
      pSVar2 = local_13d8;
      verifier_42._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_41 + (long)verifier_41._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_42,pcVar8,(allocator<char> *)((long)&verifier_42 + 7));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_13d8);
      std::operator+(&local_13f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_42,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_41._4_4_;
      anon_unknown_2::PixelStoreTestCase::PixelStoreTestCase
                (this_15,pCVar1,pSVar2,pcVar8,pixelStoreStates[lVar9].name,
                 *(GLenum *)&pixelStoreStates[lVar9].description,
                 *(int *)((long)&pixelStoreStates[lVar9].description + 4));
      verifier_42._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
      std::__cxx11::string::~string((string *)&local_13f8);
      std::__cxx11::string::~string((string *)&_verifierNdx_42);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_42 + 7));
    }
  }
  for (verifier_42._0_4_ = 0; (int)verifier_42 < 4; verifier_42._0_4_ = (int)verifier_42 + 1) {
    local_1428 = normalVerifiers[(long)(int)verifier_42 + -1];
    pPVar20 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pSVar2 = local_1428;
    verifier_43._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_43,"unpack_alignment",
               (allocator<char> *)((long)&verifier_43 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1428);
    std::operator+(&local_1448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_43,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar20,pCVar1,pSVar2,pcVar8,"UNPACK_ALIGNMENT",0xcf5);
    verifier_43._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar20);
    std::__cxx11::string::~string((string *)&local_1448);
    std::__cxx11::string::~string((string *)&_verifierNdx_43);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_43 + 7));
  }
  for (verifier_43._0_4_ = 0; (int)verifier_43 < 4; verifier_43._0_4_ = (int)verifier_43 + 1) {
    local_1478 = normalVerifiers[(long)(int)verifier_43 + -1];
    pPVar20 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pSVar2 = local_1478;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14b8,"pack_alignment",&local_14b9);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1478);
    std::operator+(&local_1498,&local_14b8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar20,pCVar1,pSVar2,pcVar8,"PACK_ALIGNMENT",0xd05);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar20);
    std::__cxx11::string::~string((string *)&local_1498);
    std::__cxx11::string::~string((string *)&local_14b8);
    std::allocator<char>::~allocator(&local_14b9);
  }
  memcpy(&_verifierNdx_44,&PTR_anon_var_dwarf_3ecf67_015a4910,0x60);
  for (verifier_44._4_4_ = 0; verifier_44._4_4_ < 4; verifier_44._4_4_ = verifier_44._4_4_ + 1) {
    for (verifier_44._0_4_ = 0; (int)verifier_44 < 4; verifier_44._0_4_ = (int)verifier_44 + 1) {
      local_1538 = normalVerifiers[(long)(int)verifier_44 + -1];
      this_16 = (BlendFuncTestCase *)operator_new(0xa8);
      pSVar2 = local_1538;
      verifier_45._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_44 + (long)verifier_44._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_45,pcVar8,(allocator<char> *)((long)&verifier_45 + 7));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1538);
      std::operator+(&local_1558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_45,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_44._4_4_;
      anon_unknown_2::BlendFuncTestCase::BlendFuncTestCase
                (this_16,pCVar1,pSVar2,pcVar8,blendColorStates[lVar9].name,
                 *(GLenum *)&blendColorStates[lVar9].description,
                 *(int *)((long)&blendColorStates[lVar9].description + 4));
      verifier_45._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
      std::__cxx11::string::~string((string *)&local_1558);
      std::__cxx11::string::~string((string *)&_verifierNdx_45);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_45 + 7));
    }
    for (verifier_45._0_4_ = 0; (int)verifier_45 < 4; verifier_45._0_4_ = (int)verifier_45 + 1) {
      local_1588 = normalVerifiers[(long)(int)verifier_45 + -1];
      pTVar14 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_1588;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_44 + (long)verifier_44._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_15e8,pcVar8,&local_15e9);
      std::operator+(&local_15c8,&local_15e8,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1588);
      std::operator+(&local_15a8,&local_15c8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_44._4_4_;
      anon_unknown_2::BlendFuncSeparateTestCase::BlendFuncSeparateTestCase
                ((BlendFuncSeparateTestCase *)pTVar14,pCVar1,pSVar2,pcVar8,
                 blendColorStates[lVar9].name,*(GLenum *)&blendColorStates[lVar9].description,
                 *(int *)((long)&blendColorStates[lVar9].description + 4));
      tcu::TestNode::addChild((TestNode *)this,pTVar14);
      std::__cxx11::string::~string((string *)&local_15a8);
      std::__cxx11::string::~string((string *)&local_15c8);
      std::__cxx11::string::~string((string *)&local_15e8);
      std::allocator<char>::~allocator(&local_15e9);
    }
  }
  memcpy(&_verifierNdx_46,&PTR_anon_var_dwarf_3ecfc7_015a4970,0x30);
  for (verifier_46._4_4_ = 0; verifier_46._4_4_ < 2; verifier_46._4_4_ = verifier_46._4_4_ + 1) {
    for (verifier_46._0_4_ = 0; (int)verifier_46 < 4; verifier_46._0_4_ = (int)verifier_46 + 1) {
      local_1638 = normalVerifiers[(long)(int)verifier_46 + -1];
      this_17 = (BlendEquationTestCase *)operator_new(0xa8);
      pSVar2 = local_1638;
      verifier_47._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_46 + (long)verifier_46._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_47,pcVar8,(allocator<char> *)((long)&verifier_47 + 7));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1638);
      std::operator+(&local_1658,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_47,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_46._4_4_;
      anon_unknown_2::BlendEquationTestCase::BlendEquationTestCase
                (this_17,pCVar1,pSVar2,pcVar8,blendEquationStates[lVar9].name,
                 *(GLenum *)&blendEquationStates[lVar9].description,
                 *(int *)((long)&blendEquationStates[lVar9].description + 4));
      verifier_47._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
      std::__cxx11::string::~string((string *)&local_1658);
      std::__cxx11::string::~string((string *)&_verifierNdx_47);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_47 + 7));
    }
    for (verifier_47._0_4_ = 0; (int)verifier_47 < 4; verifier_47._0_4_ = (int)verifier_47 + 1) {
      local_1688 = normalVerifiers[(long)(int)verifier_47 + -1];
      pTVar14 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_1688;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_46 + (long)verifier_46._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_16e8,pcVar8,&local_16e9);
      std::operator+(&local_16c8,&local_16e8,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1688);
      std::operator+(&local_16a8,&local_16c8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_46._4_4_;
      anon_unknown_2::BlendEquationSeparateTestCase::BlendEquationSeparateTestCase
                ((BlendEquationSeparateTestCase *)pTVar14,pCVar1,pSVar2,pcVar8,
                 blendEquationStates[lVar9].name,*(GLenum *)&blendEquationStates[lVar9].description,
                 *(int *)((long)&blendEquationStates[lVar9].description + 4));
      tcu::TestNode::addChild((TestNode *)this,pTVar14);
      std::__cxx11::string::~string((string *)&local_16a8);
      std::__cxx11::string::~string((string *)&local_16c8);
      std::__cxx11::string::~string((string *)&local_16e8);
      std::allocator<char>::~allocator(&local_16e9);
    }
  }
  memcpy(&_verifierNdx_48,&DAT_015a49a0,0x60);
  for (verifier_48._4_4_ = 0; verifier_48._4_4_ < 3; verifier_48._4_4_ = verifier_48._4_4_ + 1) {
    for (verifier_48._0_4_ = 0; (int)verifier_48 < 4; verifier_48._0_4_ = (int)verifier_48 + 1) {
      local_1768 = normalVerifiers[(long)(int)verifier_48 + -1];
      this_18 = (ImplementationArrayTestCase *)operator_new(0xb0);
      pSVar2 = local_1768;
      bufferBindingStates[6].type._2_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_48 + (long)verifier_48._4_4_ * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_17a8,pcVar8,
                 (allocator<char> *)((long)&bufferBindingStates[6].type + 3));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1768);
      std::operator+(&local_1788,&local_17a8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_48._4_4_;
      anon_unknown_2::ImplementationArrayTestCase::ImplementationArrayTestCase
                (this_18,pCVar1,pSVar2,pcVar8,implementationArrayReturningStates[lVar9].name,
                 *(GLenum *)&implementationArrayReturningStates[lVar9].description,
                 *(GLenum *)((long)&implementationArrayReturningStates[lVar9].description + 4),
                 implementationArrayReturningStates[lVar9].target);
      bufferBindingStates[6].type._2_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
      std::__cxx11::string::~string((string *)&local_1788);
      std::__cxx11::string::~string((string *)&local_17a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bufferBindingStates[6].type + 3));
    }
  }
  memcpy(&_queryTypeNdx,&DAT_015a4a00,0xa8);
  for (queryType = QUERY_BOOLEAN; (int)queryType < 7; queryType = queryType + QUERY_BOOLEAN_VEC4) {
    for (local_1860 = 0; local_1860 < 4; local_1860 = local_1860 + 1) {
      local_1864 = init::queryTypes[local_1860];
      this_19 = (BufferBindingTestCase *)operator_new(0x88);
      QVar3 = local_1864;
      queryType_1._2_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_queryTypeNdx + (long)(int)queryType * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_queryTypeNdx_1,pcVar8,(allocator<char> *)((long)&queryType_1 + 3));
      pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1864);
      std::operator+(&local_1888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_queryTypeNdx_1,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)(int)queryType;
      anon_unknown_2::BufferBindingTestCase::BufferBindingTestCase
                (this_19,pCVar1,QVar3,pcVar8,bufferBindingStates[lVar9].name,
                 *(GLenum *)&bufferBindingStates[lVar9].description,
                 *(GLenum *)((long)&bufferBindingStates[lVar9].description + 4));
      queryType_1._2_1_ = QUERY_BOOLEAN >> 0x10;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_19);
      std::__cxx11::string::~string((string *)&local_1888);
      std::__cxx11::string::~string((string *)&_queryTypeNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_1 + 3));
    }
  }
  for (local_18b0 = 0; local_18b0 < 4; local_18b0 = local_18b0 + 1) {
    local_18b4 = init::queryTypes[local_18b0];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_18b4;
    queryType_2._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_2,"element_array_buffer_binding",
               (allocator<char> *)((long)&queryType_2 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_18b4);
    std::operator+(&local_18d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_2,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ElementArrayBufferBindingTestCase::ElementArrayBufferBindingTestCase
              ((ElementArrayBufferBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8);
    queryType_2._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_18d8);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_2 + 3));
  }
  for (local_1900 = 0; local_1900 < 4; local_1900 = local_1900 + 1) {
    local_1904 = init::queryTypes[local_1900];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_1904;
    queryType_3._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_3,"transform_feedback_binding",
               (allocator<char> *)((long)&queryType_3 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1904);
    std::operator+(&local_1928,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_3,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::TransformFeedbackBindingTestCase::TransformFeedbackBindingTestCase
              ((TransformFeedbackBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8);
    queryType_3._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_1928);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_3 + 3));
  }
  for (local_1950 = 0; local_1950 < 4; local_1950 = local_1950 + 1) {
    local_1954 = init::queryTypes[local_1950];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_1954;
    queryType_4._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_4,"current_program_binding",
               (allocator<char> *)((long)&queryType_4 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1954);
    std::operator+(&local_1978,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_4,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::CurrentProgramBindingTestCase::CurrentProgramBindingTestCase
              ((CurrentProgramBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8,"CURRENT_PROGRAM");
    queryType_4._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_1978);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_4 + 3));
  }
  for (local_19a0 = 0; local_19a0 < 4; local_19a0 = local_19a0 + 1) {
    local_19a4 = init::queryTypes[local_19a0];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_19a4;
    verifier_49._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_49,"vertex_array_binding",
               (allocator<char> *)((long)&verifier_49 + 7));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_19a4);
    std::operator+(&local_19c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_49,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::VertexArrayBindingTestCase::VertexArrayBindingTestCase
              ((VertexArrayBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8,"VERTEX_ARRAY_BINDING");
    verifier_49._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_19c8);
    std::__cxx11::string::~string((string *)&_verifierNdx_49);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_49 + 7));
  }
  for (verifier_49._0_4_ = 0; (int)verifier_49 < 4; verifier_49._0_4_ = (int)verifier_49 + 1) {
    local_19f8 = normalVerifiers[(long)(int)verifier_49 + -1];
    this_20 = (StencilClearValueTestCase *)operator_new(0xa0);
    pSVar2 = local_19f8;
    verifier_50._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_50,"stencil_clear_value",
               (allocator<char> *)((long)&verifier_50 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_19f8);
    std::operator+(&local_1a18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_50,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilClearValueTestCase::StencilClearValueTestCase
              (this_20,pCVar1,pSVar2,pcVar8,"STENCIL_CLEAR_VALUE");
    verifier_50._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_20);
    std::__cxx11::string::~string((string *)&local_1a18);
    std::__cxx11::string::~string((string *)&_verifierNdx_50);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_50 + 7));
  }
  for (verifier_50._0_4_ = 0; (int)verifier_50 < 4; verifier_50._0_4_ = (int)verifier_50 + 1) {
    local_1a48 = normalVerifiers[(long)(int)verifier_50 + -1];
    this_21 = (ActiveTextureTestCase *)operator_new(0xa0);
    pSVar2 = local_1a48;
    queryType_5._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_5,"active_texture",
               (allocator<char> *)((long)&queryType_5 + 3));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1a48);
    std::operator+(&local_1a68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_5,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ActiveTextureTestCase::ActiveTextureTestCase
              (this_21,pCVar1,pSVar2,pcVar8,"ACTIVE_TEXTURE");
    queryType_5._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_21);
    std::__cxx11::string::~string((string *)&local_1a68);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_5 + 3));
  }
  for (local_1a90 = 0; local_1a90 < 4; local_1a90 = local_1a90 + 1) {
    local_1a94 = init::queryTypes[local_1a90];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_1a94;
    queryType_6._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_6,"renderbuffer_binding",
               (allocator<char> *)((long)&queryType_6 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1a94);
    std::operator+(&local_1ab8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_6,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::RenderbufferBindingTestCase::RenderbufferBindingTestCase
              ((RenderbufferBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8,"RENDERBUFFER_BINDING");
    queryType_6._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_1ab8);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_6 + 3));
  }
  for (local_1ae0 = 0; local_1ae0 < 4; local_1ae0 = local_1ae0 + 1) {
    local_1ae4 = init::queryTypes[local_1ae0];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_1ae4;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b28,"sampler_binding",&local_1b29);
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1ae4);
    std::operator+(&local_1b08,&local_1b28,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SamplerObjectBindingTestCase::SamplerObjectBindingTestCase
              ((SamplerObjectBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8,"SAMPLER_BINDING");
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_1b08);
    std::__cxx11::string::~string((string *)&local_1b28);
    std::allocator<char>::~allocator(&local_1b29);
  }
  pvVar21 = memcpy(&_queryTypeNdx_7,&PTR_anon_var_dwarf_3ed18f_015a4ab0,0x60);
  queryType_7 = QUERY_BOOLEAN;
  while ((int)queryType_7 < 4) {
    for (local_1ba0 = 0; local_1ba0 < 4; local_1ba0 = local_1ba0 + 1) {
      local_1ba4 = init::queryTypes[local_1ba0];
      this_22 = (TextureBindingTestCase *)operator_new(0x88);
      QVar3 = local_1ba4;
      queryType_8._2_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_queryTypeNdx_7 + (long)(int)queryType_7 * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_queryTypeNdx_8,pcVar8,(allocator<char> *)((long)&queryType_8 + 3));
      pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1ba4);
      std::operator+(&local_1bc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_queryTypeNdx_8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)(int)queryType_7;
      anon_unknown_2::TextureBindingTestCase::TextureBindingTestCase
                (this_22,pCVar1,QVar3,pcVar8,textureBindings[lVar9].name,
                 *(GLenum *)&textureBindings[lVar9].description,
                 *(GLenum *)((long)&textureBindings[lVar9].description + 4));
      queryType_8._2_1_ = QUERY_BOOLEAN >> 0x10;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_22);
      std::__cxx11::string::~string((string *)&local_1bc8);
      std::__cxx11::string::~string((string *)&_queryTypeNdx_8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_8 + 3));
    }
    queryType_7 = queryType_7 + QUERY_BOOLEAN_VEC4;
    pvVar21 = (void *)(ulong)queryType_7;
  }
  local_1bf0 = 0;
  while ((int)local_1bf0 < 4) {
    local_1bf4 = init::queryTypes[(int)local_1bf0];
    pTVar14 = (TestNode *)operator_new(0x80);
    QVar3 = local_1bf4;
    verifier_51._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_51,"framebuffer_binding",
               (allocator<char> *)((long)&verifier_51 + 7));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1bf4);
    std::operator+(&local_1c18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_51,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::FrameBufferBindingTestCase::FrameBufferBindingTestCase
              ((FrameBufferBindingTestCase *)pTVar14,pCVar1,QVar3,pcVar8,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING");
    verifier_51._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar14);
    std::__cxx11::string::~string((string *)&local_1c18);
    std::__cxx11::string::~string((string *)&_verifierNdx_51);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_51 + 7));
    local_1bf0 = local_1bf0 + 1;
    pvVar21 = (void *)(ulong)local_1bf0;
  }
  verifier_51._0_4_ = 0;
  while ((int)(uint)verifier_51 < 4) {
    local_1c48 = normalVerifiers[(long)(int)(uint)verifier_51 + -1];
    this_23 = (ImplementationColorReadTestCase *)operator_new(0xa0);
    pSVar2 = local_1c48;
    verifier_52._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_52,"implementation_color_read",
               (allocator<char> *)((long)&verifier_52 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1c48);
    std::operator+(&local_1c68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_52,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ImplementationColorReadTestCase::ImplementationColorReadTestCase
              (this_23,pCVar1,pSVar2,pcVar8,
               "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    verifier_52._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_23);
    std::__cxx11::string::~string((string *)&local_1c68);
    std::__cxx11::string::~string((string *)&_verifierNdx_52);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_52 + 7));
    verifier_51._0_4_ = (uint)verifier_51 + 1;
    pvVar21 = (void *)(ulong)(uint)verifier_51;
  }
  verifier_52._0_4_ = 0;
  while ((int)(uint)verifier_52 < 4) {
    local_1c98 = normalVerifiers[(long)(int)(uint)verifier_52 + -1];
    this_24 = (ReadBufferCase *)operator_new(0xa0);
    pSVar2 = local_1c98;
    verifier_53._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_53,"read_buffer",(allocator<char> *)((long)&verifier_53 + 7))
    ;
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1c98);
    std::operator+(&local_1cb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_53,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ReadBufferCase::ReadBufferCase(this_24,pCVar1,pSVar2,pcVar8,"READ_BUFFER");
    verifier_53._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_24);
    std::__cxx11::string::~string((string *)&local_1cb8);
    std::__cxx11::string::~string((string *)&_verifierNdx_53);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_53 + 7));
    verifier_52._0_4_ = (uint)verifier_52 + 1;
    pvVar21 = (void *)(ulong)(uint)verifier_52;
  }
  verifier_53._0_4_ = 0;
  while ((int)(uint)verifier_53 < 4) {
    local_1ce8 = normalVerifiers[(long)(int)(uint)verifier_53 + -1];
    this_25 = (DrawBufferCase *)operator_new(0xa0);
    pSVar2 = local_1ce8;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d28,"draw_buffer",&local_1d29);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1ce8);
    std::operator+(&local_1d08,&local_1d28,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DrawBufferCase::DrawBufferCase(this_25,pCVar1,pSVar2,pcVar8,"DRAW_BUFFER");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_25);
    std::__cxx11::string::~string((string *)&local_1d08);
    std::__cxx11::string::~string((string *)&local_1d28);
    std::allocator<char>::~allocator(&local_1d29);
    verifier_53._0_4_ = (uint)verifier_53 + 1;
    pvVar21 = (void *)(ulong)(uint)verifier_53;
  }
  return (int)pvVar21;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",									"SUBPIXEL_BITS has minimum value of 4",										GL_SUBPIXEL_BITS,									4	},
		{ "max_3d_texture_size",							"MAX_3D_TEXTURE_SIZE has minimum value of 256",								GL_MAX_3D_TEXTURE_SIZE,								256	},
		{ "max_texture_size",								"MAX_TEXTURE_SIZE has minimum value of 2048",								GL_MAX_TEXTURE_SIZE,								2048},
		{ "max_array_texture_layers",						"MAX_ARRAY_TEXTURE_LAYERS has minimum value of 256",						GL_MAX_ARRAY_TEXTURE_LAYERS,						256	},
		{ "max_cube_map_texture_size",						"MAX_CUBE_MAP_TEXTURE_SIZE has minimum value of 2048",						GL_MAX_CUBE_MAP_TEXTURE_SIZE,						2048},
		{ "max_renderbuffer_size",							"MAX_RENDERBUFFER_SIZE has minimum value of 2048",							GL_MAX_RENDERBUFFER_SIZE,							2048},
		{ "max_draw_buffers",								"MAX_DRAW_BUFFERS has minimum value of 4",									GL_MAX_DRAW_BUFFERS,								4	},
		{ "max_color_attachments",							"MAX_COLOR_ATTACHMENTS has minimum value of 4",								GL_MAX_COLOR_ATTACHMENTS,							4	},
		{ "max_elements_indices",							"MAX_ELEMENTS_INDICES has minimum value of 0",								GL_MAX_ELEMENTS_INDICES,							0	},
		{ "max_elements_vertices",							"MAX_ELEMENTS_VERTICES has minimum value of 0",								GL_MAX_ELEMENTS_VERTICES,							0	},
		{ "num_extensions",									"NUM_EXTENSIONS has minimum value of 0",									GL_NUM_EXTENSIONS,									0	},
		{ "major_version",									"MAJOR_VERSION has minimum value of 3",										GL_MAJOR_VERSION,									3	},
		{ "minor_version",									"MINOR_VERSION has minimum value of 0",										GL_MINOR_VERSION,									0	},
		{ "max_vertex_attribs",								"MAX_VERTEX_ATTRIBS has minimum value of 16",								GL_MAX_VERTEX_ATTRIBS,								16	},
		{ "max_vertex_uniform_components",					"MAX_VERTEX_UNIFORM_COMPONENTS has minimum value of 1024",					GL_MAX_VERTEX_UNIFORM_COMPONENTS,					1024},
		{ "max_vertex_uniform_vectors",						"MAX_VERTEX_UNIFORM_VECTORS has minimum value of 256",						GL_MAX_VERTEX_UNIFORM_VECTORS,						256	},
		{ "max_vertex_uniform_blocks",						"MAX_VERTEX_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_VERTEX_UNIFORM_BLOCKS,						12	},
		{ "max_vertex_output_components",					"MAX_VERTEX_OUTPUT_COMPONENTS has minimum value of 64",						GL_MAX_VERTEX_OUTPUT_COMPONENTS,					64	},
		{ "max_vertex_texture_image_units",					"MAX_VERTEX_TEXTURE_IMAGE_UNITS has minimum value of 16",					GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,					16	},
		{ "max_fragment_uniform_components",				"MAX_FRAGMENT_UNIFORM_COMPONENTS has minimum value of 896",					GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,					896	},
		{ "max_fragment_uniform_vectors",					"MAX_FRAGMENT_UNIFORM_VECTORS has minimum value of 224",					GL_MAX_FRAGMENT_UNIFORM_VECTORS,					224	},
		{ "max_fragment_uniform_blocks",					"MAX_FRAGMENT_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_FRAGMENT_UNIFORM_BLOCKS,						12	},
		{ "max_fragment_input_components",					"MAX_FRAGMENT_INPUT_COMPONENTS has minimum value of 60",					GL_MAX_FRAGMENT_INPUT_COMPONENTS,					60	},
		{ "max_texture_image_units",						"MAX_TEXTURE_IMAGE_UNITS has minimum value of 16",							GL_MAX_TEXTURE_IMAGE_UNITS,							16	},
		{ "max_program_texel_offset",						"MAX_PROGRAM_TEXEL_OFFSET has minimum value of 7",							GL_MAX_PROGRAM_TEXEL_OFFSET,						7	},
		{ "max_uniform_buffer_bindings",					"MAX_UNIFORM_BUFFER_BINDINGS has minimum value of 24",						GL_MAX_UNIFORM_BUFFER_BINDINGS,						24	},
		{ "max_combined_uniform_blocks",					"MAX_COMBINED_UNIFORM_BLOCKS has minimum value of 24",						GL_MAX_COMBINED_UNIFORM_BLOCKS,						24	},
		{ "max_varying_components",							"MAX_VARYING_COMPONENTS has minimum value of 60",							GL_MAX_VARYING_COMPONENTS,							60	},
		{ "max_varying_vectors",							"MAX_VARYING_VECTORS has minimum value of 15",								GL_MAX_VARYING_VECTORS,								15	},
		{ "max_combined_texture_image_units",				"MAX_COMBINED_TEXTURE_IMAGE_UNITS has minimum value of 32",					GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,				32	},
		{ "max_transform_feedback_interleaved_components",	"MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS has minimum value of 64",	GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,	64	},
		{ "max_transform_feedback_separate_attribs",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS has minimum value of 4",			GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS,			4	},
		{ "max_transform_feedback_separate_components",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS has minimum value of 4",		GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS,		4	},
		{ "max_samples",									"MAX_SAMPLES has minimum value of 4",										GL_MAX_SAMPLES,										4	},
		{ "red_bits",										"RED_BITS has minimum value of 0",											GL_RED_BITS,										0	},
		{ "green_bits",										"GREEN_BITS has minimum value of 0",										GL_GREEN_BITS,										0	},
		{ "blue_bits",										"BLUE_BITS has minimum value of 0",											GL_BLUE_BITS,										0	},
		{ "alpha_bits",										"ALPHA_BITS has minimum value of 0",										GL_ALPHA_BITS,										0	},
		{ "depth_bits",										"DEPTH_BITS has minimum value of 0",										GL_DEPTH_BITS,										0	},
		{ "stencil_bits",									"STENCIL_BITS has minimum value of 0",										GL_STENCIL_BITS,									0	},
	};
	const LimitedStateInteger implementationMaxLimits[] =
	{
		{ "min_program_texel_offset",						"MIN_PROGRAM_TEXEL_OFFSET has maximum value of -8",							GL_MIN_PROGRAM_TEXEL_OFFSET,						-8	},
		{ "uniform_buffer_offset_alignment",				"UNIFORM_BUFFER_OFFSET_ALIGNMENT has minimum value of 1",					GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT,					256	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean, int64 and float
	StateVerifier* implementationLimitVerifiers[] = {m_verifierBoolean, m_verifierInteger64, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMaxLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMaximumValueTestCase(m_context, verifier, (std::string(implementationMaxLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMaxLimits[testNdx].description, implementationMaxLimits[testNdx].targetName, implementationMaxLimits[testNdx].value)));

	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("fragment_shader_derivative_hint")		+ verifier->getTestNamePostfix()).c_str(),		"FRAGMENT_SHADER_DERIVATIVE_HINT",	GL_FRAGMENT_SHADER_DERIVATIVE_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	const struct PixelStoreState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} pixelStoreStates[] =
	{
		{ "unpack_image_height","UNPACK_IMAGE_HEIGHT",	GL_UNPACK_IMAGE_HEIGHT,	0 },
		{ "unpack_skip_images",	"UNPACK_SKIP_IMAGES",	GL_UNPACK_SKIP_IMAGES,	0 },
		{ "unpack_row_length",	"UNPACK_ROW_LENGTH",	GL_UNPACK_ROW_LENGTH,	0 },
		{ "unpack_skip_rows",	"UNPACK_SKIP_ROWS",		GL_UNPACK_SKIP_ROWS,	0 },
		{ "unpack_skip_pixels",	"UNPACK_SKIP_PIXELS",	GL_UNPACK_SKIP_PIXELS,	0 },
		{ "pack_row_length",	"PACK_ROW_LENGTH",		GL_PACK_ROW_LENGTH,		0 },
		{ "pack_skip_rows",		"PACK_SKIP_ROWS",		GL_PACK_SKIP_ROWS,		0 },
		{ "pack_skip_pixels",	"PACK_SKIP_PIXELS",		GL_PACK_SKIP_PIXELS,	0 }
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(pixelStoreStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreTestCase(m_context, verifier, (std::string(pixelStoreStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), pixelStoreStates[testNdx].description, pixelStoreStates[testNdx].target, pixelStoreStates[testNdx].initialValue)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	const struct BlendColorState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendColorStates[] =
	{
		{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
		{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
		{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
		{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
	}

	const struct BlendEquationState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendEquationStates[] =
	{
		{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
		{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
	}

	const struct ImplementationArrayReturningState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		targetLengthTarget;
		int			minLength;
	} implementationArrayReturningStates[] =
	{
		{ "compressed_texture_formats",		"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,	GL_NUM_COMPRESSED_TEXTURE_FORMATS,	10	},
		{ "program_binary_formats",			"PROGRAM_BINARY_FORMATS",		GL_PROGRAM_BINARY_FORMATS,		GL_NUM_PROGRAM_BINARY_FORMATS,		0	},
		{ "shader_binary_formats",			"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,		GL_NUM_SHADER_BINARY_FORMATS,		0	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationArrayReturningStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase(m_context, verifier, (std::string(implementationArrayReturningStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationArrayReturningStates[testNdx].description,	implementationArrayReturningStates[testNdx].target,	implementationArrayReturningStates[testNdx].targetLengthTarget,	implementationArrayReturningStates[testNdx].minLength)));
	}

	const struct BufferBindingState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} bufferBindingStates[] =
	{
		{ "array_buffer_binding",				"ARRAY_BUFFER_BINDING",					GL_ARRAY_BUFFER_BINDING,				GL_ARRAY_BUFFER				},
		{ "uniform_buffer_binding",				"UNIFORM_BUFFER_BINDING",				GL_UNIFORM_BUFFER_BINDING,				GL_UNIFORM_BUFFER			},
		{ "pixel_pack_buffer_binding",			"PIXEL_PACK_BUFFER_BINDING",			GL_PIXEL_PACK_BUFFER_BINDING,			GL_PIXEL_PACK_BUFFER		},
		{ "pixel_unpack_buffer_binding",		"PIXEL_UNPACK_BUFFER_BINDING",			GL_PIXEL_UNPACK_BUFFER_BINDING,			GL_PIXEL_UNPACK_BUFFER		},
		{ "transform_feedback_buffer_binding",	"TRANSFORM_FEEDBACK_BUFFER_BINDING",	GL_TRANSFORM_FEEDBACK_BUFFER_BINDING,	GL_TRANSFORM_FEEDBACK_BUFFER},
		{ "copy_read_buffer_binding",			"COPY_READ_BUFFER_BINDING",				GL_COPY_READ_BUFFER_BINDING,			GL_COPY_READ_BUFFER			},
		{ "copy_write_buffer_binding",			"COPY_WRITE_BUFFER_BINDING",			GL_COPY_WRITE_BUFFER_BINDING,			GL_COPY_WRITE_BUFFER		}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(bufferBindingStates); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new BufferBindingTestCase(m_context, queryType, (std::string(bufferBindingStates[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), bufferBindingStates[testNdx].description, bufferBindingStates[testNdx].target, bufferBindingStates[testNdx].type)));
	}

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new ElementArrayBufferBindingTestCase	(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TransformFeedbackBindingTestCase	(m_context, queryType, (std::string("transform_feedback_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new VertexArrayBindingTestCase			(m_context, queryType, (std::string("vertex_array_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"VERTEX_ARRAY_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new SamplerObjectBindingTestCase		(m_context, queryType, (std::string("sampler_binding")				+ getQueryTypeSuffix(queryType)).c_str(),	"SAMPLER_BINDING")));

	const struct TextureBinding
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} textureBindings[] =
	{
		{ "texture_binding_2d",			"TEXTURE_BINDING_2D",		GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D		},
		{ "texture_binding_3d",			"TEXTURE_BINDING_3D",		GL_TEXTURE_BINDING_3D,			GL_TEXTURE_3D		},
		{ "texture_binding_2d_array",	"TEXTURE_BINDING_2D_ARRAY",	GL_TEXTURE_BINDING_2D_ARRAY,	GL_TEXTURE_2D_ARRAY	},
		{ "texture_binding_cube_map",	"TEXTURE_BINDING_CUBE_MAP",	GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(textureBindings); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new TextureBindingTestCase(m_context, queryType, (std::string(textureBindings[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), textureBindings[testNdx].description, textureBindings[testNdx].target, textureBindings[testNdx].type)));
	}


	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase		(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase	(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ReadBufferCase					(m_context, verifier, (std::string("read_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"READ_BUFFER")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DrawBufferCase					(m_context, verifier, (std::string("draw_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"DRAW_BUFFER")));
}